

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

ParquetColumnSchema * __thiscall
duckdb::ParquetReader::ParseSchemaRecursive
          (ParquetColumnSchema *__return_storage_ptr__,ParquetReader *this,idx_t depth,
          idx_t max_define,idx_t max_repeat,idx_t *next_schema_idx,idx_t *next_file_idx)

{
  idx_t iVar1;
  idx_t max_repeat_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *__k;
  size_type *psVar3;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> *this_00;
  pointer pPVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *psVar6;
  type tVar7;
  idx_t schema_index;
  pointer pcVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  element_type *peVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  idx_t iVar16;
  idx_t iVar17;
  pointer pPVar18;
  ParquetExtraTypeInfo PVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  char cVar22;
  bool bVar23;
  byte bVar24;
  type tVar25;
  ParquetFileMetadataCache *pPVar26;
  const_reference s_ele;
  idx_t iVar27;
  pointer this_01;
  unsigned_long uVar28;
  iterator iVar29;
  mapped_type *pmVar30;
  undefined8 *puVar31;
  const_reference pvVar32;
  reference pvVar33;
  LogicalType *other;
  InvalidInputException *this_02;
  IOException *pIVar34;
  type tVar35;
  idx_t iVar36;
  ulong uVar37;
  byte bVar38;
  char cVar39;
  int val;
  vector<duckdb_parquet::SchemaElement,_true> *this_03;
  pointer pPVar40;
  undefined8 uVar41;
  pointer pPVar42;
  ulong uVar43;
  string __str;
  vector<duckdb::ParquetColumnSchema,_true> child_schemas;
  undefined1 local_378 [32];
  ParquetColumnSchema root_schema;
  LogicalType result_type_1;
  LogicalType local_270;
  LogicalType local_258;
  LogicalType local_240;
  LogicalType local_228;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  case_insensitive_map_t<idx_t> name_collision_count;
  child_list_t<LogicalType> local_138;
  LogicalType local_120;
  LogicalType local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  ParquetColumnSchema local_c0;
  
  this_00 = &this->metadata;
  pPVar26 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(this_00);
  this_03 = &((pPVar26->metadata).
              super_unique_ptr<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
              ._M_t.
              super___uniq_ptr_impl<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_duckdb_parquet::FileMetaData_*,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
              .super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl)->
             schema;
  s_ele = vector<duckdb_parquet::SchemaElement,_true>::operator[](this_03,*next_schema_idx);
  schema_index = *next_schema_idx;
  tVar25 = REQUIRED;
  if (schema_index != 0) {
    tVar25 = s_ele->repetition_type;
  }
  tVar35 = REQUIRED;
  if (((ushort)s_ele->__isset & 4) != 0) {
    tVar35 = tVar25;
  }
  iVar1 = max_define + 1;
  iVar27 = iVar1;
  if (tVar35 == REQUIRED) {
    iVar27 = max_define;
  }
  max_repeat_00 = max_repeat + 1;
  iVar36 = max_repeat;
  if (tVar35 == REPEATED) {
    iVar36 = max_repeat_00;
  }
  if ((depth == 1) &&
     (pPVar26 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(this_00),
     (pPVar26->geo_metadata).
     super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
     ._M_t.
     super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
     ._M_t.
     super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
     .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl !=
     (GeoParquetFileMetadata *)0x0)) {
    pPVar26 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(this_00);
    this_01 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
              ::operator->(&pPVar26->geo_metadata);
    bVar23 = GeoParquetFileMetadata::IsGeometryColumn(this_01,&s_ele->name);
    if (bVar23) {
      iVar1 = *next_file_idx;
      *next_file_idx = iVar1 + 1;
      ParseColumnSchema(&root_schema,this,s_ele,iVar27,iVar36,schema_index,iVar1,COLUMN);
      paVar2 = &local_c0.name.field_2;
      local_c0.schema_type = root_schema.schema_type;
      paVar5 = &root_schema.name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)root_schema.name._M_dataplus._M_p == paVar5) {
        local_c0.name.field_2._8_8_ = root_schema.name.field_2._8_8_;
        local_c0.name._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_c0.name._M_dataplus._M_p = root_schema.name._M_dataplus._M_p;
      }
      local_c0.name._M_string_length = root_schema.name._M_string_length;
      root_schema.name._M_string_length = 0;
      root_schema.name.field_2._M_allocated_capacity =
           root_schema.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      root_schema.name._M_dataplus._M_p = (pointer)paVar5;
      LogicalType::LogicalType(&local_c0.type,&root_schema.type);
      local_c0.parquet_type = root_schema.parquet_type;
      local_c0.type_info = root_schema.type_info;
      local_c0.parent_schema_index.index = root_schema.parent_schema_index.index;
      local_c0.type_length = root_schema.type_length;
      local_c0.type_scale = root_schema.type_scale;
      local_c0.schema_index = root_schema.schema_index;
      local_c0.column_index = root_schema.column_index;
      local_c0.max_define = root_schema.max_define;
      local_c0.max_repeat = root_schema.max_repeat;
      local_c0.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_start =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c0.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GeoParquetFileMetadata::GeometryType();
      ParquetColumnSchema::ParquetColumnSchema(__return_storage_ptr__,&local_c0,&local_228,GEOMETRY)
      ;
      LogicalType::~LogicalType(&local_228);
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector(&local_c0.children.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             );
      LogicalType::~LogicalType(&local_c0.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0.name._M_dataplus._M_p);
      }
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector(&root_schema.children.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             );
      LogicalType::~LogicalType(&root_schema.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)root_schema.name._M_dataplus._M_p == &root_schema.name.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_01b575e9;
    }
  }
  if ((((ushort)s_ele->__isset & 8) == 0) || (val = s_ele->num_children, val < 1)) {
    if (((ushort)s_ele->__isset & 1) == 0) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      root_schema._0_8_ = &root_schema.name._M_string_length;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&root_schema,
                 "Node \'%s\' has neither num_children nor type set - this violates the Parquet spec (corrupted file)"
                 ,"");
      InvalidInputException::InvalidInputException<char_const*>
                (this_02,(string *)&root_schema,(s_ele->name)._M_dataplus._M_p);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar1 = *next_file_idx;
    *next_file_idx = iVar1 + 1;
    ParseColumnSchema(&root_schema,this,s_ele,iVar27,iVar36,schema_index,iVar1,COLUMN);
    if (s_ele->repetition_type == REPEATED) {
      LogicalType::LIST((LogicalType *)&name_collision_count,&root_schema.type);
      pcVar8 = (s_ele->name)._M_dataplus._M_p;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar8,pcVar8 + (s_ele->name)._M_string_length);
      LogicalType::LogicalType(&local_120,(LogicalType *)&name_collision_count);
      ParquetColumnSchema::ParquetColumnSchema
                (__return_storage_ptr__,&local_210,&local_120,iVar27,iVar36,schema_index,
                 *next_file_idx,COLUMN);
      LogicalType::~LogicalType(&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>
                (&(__return_storage_ptr__->children).
                  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 ,&root_schema);
      LogicalType::~LogicalType((LogicalType *)&name_collision_count);
    }
    else {
      paVar5 = &root_schema.name.field_2;
      __return_storage_ptr__->schema_type = root_schema.schema_type;
      paVar2 = &(__return_storage_ptr__->name).field_2;
      (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)root_schema.name._M_dataplus._M_p == paVar5) {
        paVar2->_M_allocated_capacity = root_schema.name.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) =
             root_schema.name.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->name)._M_dataplus._M_p = root_schema.name._M_dataplus._M_p;
        (__return_storage_ptr__->name).field_2._M_allocated_capacity =
             root_schema.name.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->name)._M_string_length = root_schema.name._M_string_length;
      root_schema.name._M_string_length = 0;
      root_schema.name.field_2._M_allocated_capacity =
           root_schema.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      root_schema.name._M_dataplus._M_p = (pointer)paVar5;
      LogicalType::LogicalType(&__return_storage_ptr__->type,&root_schema.type);
      __return_storage_ptr__->parquet_type = root_schema.parquet_type;
      __return_storage_ptr__->type_info = root_schema.type_info;
      (__return_storage_ptr__->parent_schema_index).index = root_schema.parent_schema_index.index;
      __return_storage_ptr__->type_length = root_schema.type_length;
      __return_storage_ptr__->type_scale = root_schema.type_scale;
      __return_storage_ptr__->schema_index = root_schema.schema_index;
      __return_storage_ptr__->column_index = root_schema.column_index;
      __return_storage_ptr__->max_define = root_schema.max_define;
      __return_storage_ptr__->max_repeat = root_schema.max_repeat;
      (__return_storage_ptr__->children).
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_start =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->children).
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->children).
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    ~vector(&root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           );
    LogicalType::~LogicalType(&root_schema.type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)root_schema.name._M_dataplus._M_p == &root_schema.name.field_2) {
      return __return_storage_ptr__;
    }
LAB_01b575e9:
    operator_delete(root_schema.name._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
  child_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  child_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  child_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar43 = 0; uVar28 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val),
      pPVar18 = child_schemas.
                super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                .
                super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                ._M_impl.super__Vector_impl_data._M_finish, uVar43 < uVar28; uVar43 = uVar43 + 1) {
    *next_schema_idx = *next_schema_idx + 1;
    ParseSchemaRecursive(&root_schema,this,depth + 1,iVar27,iVar36,next_schema_idx,next_file_idx);
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    emplace_back<duckdb::ParquetColumnSchema>
              (&child_schemas.
                super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               ,&root_schema);
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    ~vector(&root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           );
    LogicalType::~LogicalType(&root_schema.type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)root_schema.name._M_dataplus._M_p != &root_schema.name.field_2) {
      operator_delete(root_schema.name._M_dataplus._M_p);
    }
    val = s_ele->num_children;
  }
  name_collision_count._M_h._M_buckets = &name_collision_count._M_h._M_single_bucket;
  name_collision_count._M_h._M_bucket_count = 1;
  name_collision_count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  name_collision_count._M_h._M_element_count = 0;
  name_collision_count._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  name_collision_count._M_h._M_rehash_policy._M_next_resize = 0;
  name_collision_count._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (child_schemas.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      child_schemas.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar6 = &root_schema.name._M_string_length;
    pPVar42 = child_schemas.
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              .
              super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      __k = &pPVar42->name;
      while (iVar29 = ::std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)&name_collision_count,__k),
            iVar29.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur != (__node_type *)0x0) {
        pmVar30 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&name_collision_count,__k);
        *pmVar30 = *pmVar30 + 1;
        local_378._0_8_ = local_378 + 0x10;
        pcVar8 = (pPVar42->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_378,pcVar8,pcVar8 + (pPVar42->name)._M_string_length);
        ::std::__cxx11::string::append((char *)local_378);
        pmVar30 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&name_collision_count,__k);
        uVar43 = *pmVar30;
        cVar39 = '\x01';
        if (9 < uVar43) {
          uVar37 = uVar43;
          cVar22 = '\x04';
          do {
            cVar39 = cVar22;
            if (uVar37 < 100) {
              cVar39 = cVar39 + -2;
              goto LAB_01b56e0f;
            }
            if (uVar37 < 1000) {
              cVar39 = cVar39 + -1;
              goto LAB_01b56e0f;
            }
            if (uVar37 < 10000) goto LAB_01b56e0f;
            bVar23 = 99999 < uVar37;
            uVar37 = uVar37 / 10000;
            cVar22 = cVar39 + '\x04';
          } while (bVar23);
          cVar39 = cVar39 + '\x01';
        }
LAB_01b56e0f:
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&__str,cVar39);
        ::std::__detail::__to_chars_10_impl<unsigned_long>
                  (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar43);
        pPVar40 = (pointer)0xf;
        if ((pointer)local_378._0_8_ != (pointer)(local_378 + 0x10)) {
          pPVar40 = (pointer)local_378._16_8_;
        }
        pPVar4 = (pointer)((long)(ParquetColumnSchemaType *)local_378._8_8_ + __str._M_string_length
                          );
        if (pPVar40 < pPVar4) {
          uVar41 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            uVar41 = __str.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar41 < pPVar4) goto LAB_01b56e80;
          puVar31 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,local_378._0_8_);
        }
        else {
LAB_01b56e80:
          puVar31 = (undefined8 *)
                    ::std::__cxx11::string::_M_append(local_378,(ulong)__str._M_dataplus._M_p);
        }
        psVar3 = puVar31 + 2;
        if ((size_type *)*puVar31 == psVar3) {
          root_schema.name._M_string_length = *psVar3;
          root_schema.name.field_2._M_allocated_capacity = puVar31[3];
          root_schema._0_8_ = psVar6;
        }
        else {
          root_schema.name._M_string_length = *psVar3;
          root_schema._0_8_ = (size_type *)*puVar31;
        }
        root_schema.name._M_dataplus._M_p = (pointer)puVar31[1];
        *puVar31 = psVar3;
        puVar31[1] = 0;
        *(undefined1 *)psVar3 = 0;
        ::std::__cxx11::string::operator=((string *)__k,(string *)&root_schema);
        if ((size_type *)root_schema._0_8_ != psVar6) {
          operator_delete((void *)root_schema._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p);
        }
        if ((pointer)local_378._0_8_ != (pointer)(local_378 + 0x10)) {
          operator_delete((void *)local_378._0_8_);
        }
      }
      ::std::__cxx11::string::_M_assign((string *)__k);
      pmVar30 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&name_collision_count,__k);
      *pmVar30 = 0;
      pPVar42 = pPVar42 + 1;
    } while (pPVar42 != pPVar18);
  }
  bVar38 = SUB21(s_ele->__isset,0);
  tVar7 = s_ele->converted_type;
  bVar24 = tVar7 == MAP_KEY_VALUE & bVar38 >> 4;
  if ((~bVar24 & schema_index != 0) == 0) {
    if (bVar24 == 0) goto LAB_01b57246;
  }
  else {
    pvVar32 = vector<duckdb_parquet::SchemaElement,_true>::operator[](this_03,schema_index - 1);
    if ((((~*(uint *)&pvVar32->__isset & 0x18) != 0) || (pvVar32->converted_type != MAP)) ||
       (pvVar32->num_children != 1)) {
LAB_01b57246:
      ParquetColumnSchema::ParquetColumnSchema(__return_storage_ptr__);
      pPVar18 = child_schemas.
                super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                .
                super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (((ulong)(((long)child_schemas.
                          super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                          .
                          super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)child_schemas.
                          super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                          .
                          super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7) < 2
          ) && ((bVar38 >> 4 & (tVar7 & ~MAP_KEY_VALUE) == MAP) != 0 || tVar35 == REPEATED)) {
        pvVar33 = vector<duckdb::ParquetColumnSchema,_true>::operator[](&child_schemas,0);
        __return_storage_ptr__->schema_type = pvVar33->schema_type;
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->name,(string *)&pvVar33->name);
        (__return_storage_ptr__->type).id_ = (pvVar33->type).id_;
        (__return_storage_ptr__->type).physical_type_ = (pvVar33->type).physical_type_;
        uVar10 = *(undefined4 *)
                  &(__return_storage_ptr__->type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar11 = *(undefined4 *)
                  ((long)&(__return_storage_ptr__->type).type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        uVar12 = *(undefined4 *)
                  &(__return_storage_ptr__->type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar13 = *(undefined4 *)
                  ((long)&(__return_storage_ptr__->type).type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar14 = (pvVar33->type).type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var15 = (pvVar33->type).type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (pvVar33->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pvVar33->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var9 = (__return_storage_ptr__->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar14;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var15;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        }
        p_Var9 = (pvVar33->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        *(undefined4 *)
         &(pvVar33->type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar10;
        *(undefined4 *)
         ((long)&(pvVar33->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
             uVar11;
        *(undefined4 *)
         &(pvVar33->type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             uVar12;
        *(undefined4 *)
         ((long)&(pvVar33->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi + 4) = uVar13;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        }
        PVar19 = pvVar33->type_info;
        __return_storage_ptr__->parquet_type = pvVar33->parquet_type;
        __return_storage_ptr__->type_info = PVar19;
        iVar27 = pvVar33->max_define;
        iVar36 = pvVar33->max_repeat;
        iVar16 = pvVar33->schema_index;
        iVar17 = pvVar33->column_index;
        uVar20 = pvVar33->type_length;
        uVar21 = pvVar33->type_scale;
        (__return_storage_ptr__->parent_schema_index).index = (pvVar33->parent_schema_index).index;
        __return_storage_ptr__->type_length = uVar20;
        __return_storage_ptr__->type_scale = uVar21;
        __return_storage_ptr__->schema_index = iVar16;
        __return_storage_ptr__->column_index = iVar17;
        __return_storage_ptr__->max_define = iVar27;
        __return_storage_ptr__->max_repeat = iVar36;
        root_schema.name._M_string_length =
             (size_type)
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pPVar18 = (pvVar33->children).
                  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                  .
                  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        root_schema._0_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        root_schema.name._M_dataplus._M_p =
             (pointer)(__return_storage_ptr__->children).
                      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                      .
                      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pvVar33->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPVar18;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pvVar33->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pvVar33->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar33->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar33->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )&root_schema);
        ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
      }
      else {
        __str._M_dataplus._M_p = (pointer)0x0;
        __str._M_string_length = 0;
        __str.field_2._M_allocated_capacity = 0;
        if (child_schemas.
            super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
            super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            child_schemas.
            super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
            super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        }
        else {
          pPVar42 = child_schemas.
                    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                    .
                    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            ::std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                        *)&root_schema,&pPVar42->name,&pPVar42->type);
            ::std::
            vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
            ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                      ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                        *)&__str,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                        *)&root_schema);
            LogicalType::~LogicalType((LogicalType *)((long)&root_schema.name.field_2 + 8));
            if ((size_type *)root_schema._0_8_ != &root_schema.name._M_string_length) {
              operator_delete((void *)root_schema._0_8_);
            }
            pPVar42 = pPVar42 + 1;
          } while (pPVar42 != pPVar18);
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)__str.field_2._M_allocated_capacity;
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = __str._M_dataplus._M_p._0_4_;
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = __str._M_dataplus._M_p._4_4_;
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (uint)__str._M_string_length;
          local_138.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = __str._M_string_length._4_4_;
        }
        __str._M_dataplus._M_p = (pointer)0x0;
        __str._M_string_length = 0;
        __str.field_2._M_allocated_capacity = 0;
        LogicalType::STRUCT(&result_type_1,&local_138);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_138);
        pcVar8 = (s_ele->name)._M_dataplus._M_p;
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,pcVar8,pcVar8 + (s_ele->name)._M_string_length);
        LogicalType::LogicalType(&local_f0,&result_type_1);
        ParquetColumnSchema::ParquetColumnSchema
                  (&root_schema,&local_1d0,&local_f0,iVar27,iVar36,schema_index,*next_file_idx,
                   COLUMN);
        LogicalType::~LogicalType(&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        local_378._16_8_ =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_378._8_8_ =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_378._0_8_ =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             child_schemas.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start =
             child_schemas.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             child_schemas.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        child_schemas.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        child_schemas.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        child_schemas.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )local_378);
        __return_storage_ptr__->schema_type = root_schema.schema_type;
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->name,(string *)&root_schema.name);
        (__return_storage_ptr__->type).id_ = root_schema.type.id_;
        (__return_storage_ptr__->type).physical_type_ = root_schema.type.physical_type_;
        peVar14 = (__return_storage_ptr__->type).type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var9 = (__return_storage_ptr__->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             root_schema.type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             root_schema.type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_378._16_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __return_storage_ptr__->parquet_type = root_schema.parquet_type;
        __return_storage_ptr__->type_info = root_schema.type_info;
        (__return_storage_ptr__->parent_schema_index).index = root_schema.parent_schema_index.index;
        __return_storage_ptr__->type_length = root_schema.type_length;
        __return_storage_ptr__->type_scale = root_schema.type_scale;
        __return_storage_ptr__->schema_index = root_schema.schema_index;
        __return_storage_ptr__->column_index = root_schema.column_index;
        __return_storage_ptr__->max_define = root_schema.max_define;
        __return_storage_ptr__->max_repeat = root_schema.max_repeat;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_378._0_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_378._8_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar14;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var9;
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )local_378);
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector(&root_schema.children.
                 super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               );
        LogicalType::~LogicalType(&root_schema.type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)root_schema.name._M_dataplus._M_p != &root_schema.name.field_2) {
          operator_delete(root_schema.name._M_dataplus._M_p);
        }
        LogicalType::~LogicalType(&result_type_1);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&__str);
      }
      if (tVar35 == REPEATED) {
        LogicalType::LIST((LogicalType *)&__str,&__return_storage_ptr__->type);
        pcVar8 = (s_ele->name)._M_dataplus._M_p;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,pcVar8,pcVar8 + (s_ele->name)._M_string_length);
        LogicalType::LogicalType(&local_108,(LogicalType *)&__str);
        ParquetColumnSchema::ParquetColumnSchema
                  (&root_schema,&local_1f0,&local_108,iVar1,max_repeat_00,schema_index,
                   *next_file_idx,COLUMN);
        LogicalType::~LogicalType(&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        emplace_back<duckdb::ParquetColumnSchema>
                  (&root_schema.children.
                    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                   ,__return_storage_ptr__);
        __return_storage_ptr__->schema_type = root_schema.schema_type;
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->name,(string *)&root_schema.name);
        (__return_storage_ptr__->type).id_ = root_schema.type.id_;
        (__return_storage_ptr__->type).physical_type_ = root_schema.type.physical_type_;
        peVar14 = (__return_storage_ptr__->type).type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var9 = (__return_storage_ptr__->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             root_schema.type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             root_schema.type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_378._16_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __return_storage_ptr__->parquet_type = root_schema.parquet_type;
        __return_storage_ptr__->type_info = root_schema.type_info;
        (__return_storage_ptr__->parent_schema_index).index = root_schema.parent_schema_index.index;
        __return_storage_ptr__->type_length = root_schema.type_length;
        __return_storage_ptr__->type_scale = root_schema.type_scale;
        __return_storage_ptr__->schema_index = root_schema.schema_index;
        __return_storage_ptr__->column_index = root_schema.column_index;
        __return_storage_ptr__->max_define = root_schema.max_define;
        __return_storage_ptr__->max_repeat = root_schema.max_repeat;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_378._0_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_378._8_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar14;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var9;
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )local_378);
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector(&root_schema.children.
                 super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               );
        LogicalType::~LogicalType(&root_schema.type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)root_schema.name._M_dataplus._M_p != &root_schema.name.field_2) {
          operator_delete(root_schema.name._M_dataplus._M_p);
        }
        LogicalType::~LogicalType((LogicalType *)&__str);
      }
      optional_idx::optional_idx((optional_idx *)&root_schema,schema_index);
      (__return_storage_ptr__->parent_schema_index).index = root_schema._0_8_;
      goto LAB_01b579a9;
    }
  }
  if ((long)child_schemas.
            super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
            super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)child_schemas.
            super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
            super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x120) {
    pIVar34 = (IOException *)__cxa_allocate_exception(0x10);
    root_schema._0_8_ = &root_schema.name._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&root_schema,"MAP_KEY_VALUE requires two children","");
    IOException::IOException(pIVar34,(string *)&root_schema);
    __cxa_throw(pIVar34,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (tVar35 != REPEATED) {
    pIVar34 = (IOException *)__cxa_allocate_exception(0x10);
    root_schema._0_8_ = &root_schema.name._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&root_schema,"MAP_KEY_VALUE needs to be repeated","");
    IOException::IOException(pIVar34,(string *)&root_schema);
    __cxa_throw(pIVar34,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar33 = vector<duckdb::ParquetColumnSchema,_true>::operator[](&child_schemas,0);
  LogicalType::LogicalType(&local_240,&pvVar33->type);
  pvVar33 = vector<duckdb::ParquetColumnSchema,_true>::operator[](&child_schemas,1);
  LogicalType::LogicalType(&local_258,&pvVar33->type);
  LogicalType::MAP((LogicalType *)&__str,&local_240,&local_258);
  LogicalType::~LogicalType(&local_258);
  LogicalType::~LogicalType(&local_240);
  pcVar8 = (s_ele->name)._M_dataplus._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar8,pcVar8 + (s_ele->name)._M_string_length);
  other = ListType::GetChildType((LogicalType *)&__str);
  LogicalType::LogicalType(&local_270,other);
  ParquetColumnSchema::ParquetColumnSchema
            (&root_schema,&local_190,&local_270,max_define,max_repeat,schema_index,*next_file_idx,
             COLUMN);
  LogicalType::~LogicalType(&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_378._16_8_ =
       root_schema.children.
       super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
       super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_378._8_8_ =
       root_schema.children.
       super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
       super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_378._0_8_ =
       root_schema.children.
       super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
       super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
       ._M_impl.super__Vector_impl_data._M_start;
  root_schema.children.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       child_schemas.
       super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
       super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  root_schema.children.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_start =
       child_schemas.
       super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
       super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
       ._M_impl.super__Vector_impl_data._M_start;
  root_schema.children.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       child_schemas.
       super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
       super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  child_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  child_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  child_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            ((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *)
             local_378);
  pcVar8 = (s_ele->name)._M_dataplus._M_p;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar8,pcVar8 + (s_ele->name)._M_string_length);
  LogicalType::LogicalType(&local_d8,(LogicalType *)&__str);
  ParquetColumnSchema::ParquetColumnSchema
            (__return_storage_ptr__,&local_1b0,&local_d8,iVar1,max_repeat_00,schema_index,
             *next_file_idx,COLUMN);
  LogicalType::~LogicalType(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
  emplace_back<duckdb::ParquetColumnSchema>
            (&(__return_storage_ptr__->children).
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ,&root_schema);
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            (&root_schema.children.
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            );
  LogicalType::~LogicalType(&root_schema.type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)root_schema.name._M_dataplus._M_p != &root_schema.name.field_2) {
    operator_delete(root_schema.name._M_dataplus._M_p);
  }
  LogicalType::~LogicalType((LogicalType *)&__str);
LAB_01b579a9:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&name_collision_count);
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            (&child_schemas.
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ParquetColumnSchema ParquetReader::ParseSchemaRecursive(idx_t depth, idx_t max_define, idx_t max_repeat,
                                                        idx_t &next_schema_idx, idx_t &next_file_idx) {

	auto file_meta_data = GetFileMetadata();
	D_ASSERT(file_meta_data);
	D_ASSERT(next_schema_idx < file_meta_data->schema.size());
	auto &s_ele = file_meta_data->schema[next_schema_idx];
	auto this_idx = next_schema_idx;

	auto repetition_type = FieldRepetitionType::REQUIRED;
	if (s_ele.__isset.repetition_type && this_idx > 0) {
		repetition_type = s_ele.repetition_type;
	}
	if (repetition_type != FieldRepetitionType::REQUIRED) {
		max_define++;
	}
	if (repetition_type == FieldRepetitionType::REPEATED) {
		max_repeat++;
	}

	// Check for geoparquet spatial types
	if (depth == 1) {
		// geoparquet types have to be at the root of the schema, and have to be present in the kv metadata
		if (metadata->geo_metadata && metadata->geo_metadata->IsGeometryColumn(s_ele.name)) {
			auto root_schema = ParseColumnSchema(s_ele, max_define, max_repeat, this_idx, next_file_idx++);
			return ParquetColumnSchema(std::move(root_schema), GeoParquetFileMetadata::GeometryType(),
			                           ParquetColumnSchemaType::GEOMETRY);
		}
	}

	if (s_ele.__isset.num_children && s_ele.num_children > 0) { // inner node
		vector<ParquetColumnSchema> child_schemas;

		idx_t c_idx = 0;
		while (c_idx < NumericCast<idx_t>(s_ele.num_children)) {
			next_schema_idx++;

			auto child_schema = ParseSchemaRecursive(depth + 1, max_define, max_repeat, next_schema_idx, next_file_idx);
			child_schemas.push_back(std::move(child_schema));
			c_idx++;
		}
		// rename child type entries if there are case-insensitive duplicates by appending _1, _2 etc.
		// behavior consistent with CSV reader fwiw
		case_insensitive_map_t<idx_t> name_collision_count;
		for (auto &child_schema : child_schemas) {
			auto &col_name = child_schema.name;
			// avoid duplicate header names
			while (name_collision_count.find(col_name) != name_collision_count.end()) {
				name_collision_count[col_name] += 1;
				col_name = col_name + "_" + to_string(name_collision_count[col_name]);
			}
			child_schema.name = col_name;
			name_collision_count[col_name] = 0;
		}

		bool is_repeated = repetition_type == FieldRepetitionType::REPEATED;
		bool is_list = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::LIST;
		bool is_map = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::MAP;
		bool is_map_kv = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::MAP_KEY_VALUE;
		if (!is_map_kv && this_idx > 0) {
			// check if the parent node of this is a map
			auto &p_ele = file_meta_data->schema[this_idx - 1];
			bool parent_is_map = p_ele.__isset.converted_type && p_ele.converted_type == ConvertedType::MAP;
			bool parent_has_children = p_ele.__isset.num_children && p_ele.num_children == 1;
			is_map_kv = parent_is_map && parent_has_children;
		}

		if (is_map_kv) {
			if (child_schemas.size() != 2) {
				throw IOException("MAP_KEY_VALUE requires two children");
			}
			if (!is_repeated) {
				throw IOException("MAP_KEY_VALUE needs to be repeated");
			}
			auto result_type = LogicalType::MAP(child_schemas[0].type, child_schemas[1].type);
			ParquetColumnSchema struct_schema(s_ele.name, ListType::GetChildType(result_type), max_define - 1,
			                                  max_repeat - 1, this_idx, next_file_idx);
			struct_schema.children = std::move(child_schemas);

			ParquetColumnSchema map_schema(s_ele.name, std::move(result_type), max_define, max_repeat, this_idx,
			                               next_file_idx);
			map_schema.children.push_back(std::move(struct_schema));
			return map_schema;
		}
		ParquetColumnSchema result;
		if (child_schemas.size() > 1 || (!is_list && !is_map && !is_repeated)) {
			child_list_t<LogicalType> struct_types;
			for (auto &child_schema : child_schemas) {
				struct_types.emplace_back(make_pair(child_schema.name, child_schema.type));
			}

			auto result_type = LogicalType::STRUCT(std::move(struct_types));
			ParquetColumnSchema struct_schema(s_ele.name, std::move(result_type), max_define, max_repeat, this_idx,
			                                  next_file_idx);
			struct_schema.children = std::move(child_schemas);
			result = std::move(struct_schema);
		} else {
			// if we have a struct with only a single type, pull up
			result = std::move(child_schemas[0]);
			result.name = s_ele.name;
		}
		if (is_repeated) {
			auto list_type = LogicalType::LIST(result.type);
			ParquetColumnSchema list_schema(s_ele.name, std::move(list_type), max_define, max_repeat, this_idx,
			                                next_file_idx);
			list_schema.children.push_back(std::move(result));
			result = std::move(list_schema);
		}
		result.parent_schema_index = this_idx;
		return result;
	} else { // leaf node
		if (!s_ele.__isset.type) {
			throw InvalidInputException(
			    "Node '%s' has neither num_children nor type set - this violates the Parquet spec (corrupted file)",
			    s_ele.name.c_str());
		}
		auto result = ParseColumnSchema(s_ele, max_define, max_repeat, this_idx, next_file_idx++);
		if (s_ele.repetition_type == FieldRepetitionType::REPEATED) {
			auto list_type = LogicalType::LIST(result.type);
			ParquetColumnSchema list_schema(s_ele.name, std::move(list_type), max_define, max_repeat, this_idx,
			                                next_file_idx);
			list_schema.children.push_back(std::move(result));
			return list_schema;
		}
		return result;
	}
}